

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::AddContextHook(ImGuiContext *ctx,ImGuiContextHook *hook)

{
  ImGuiContext *g;
  ImGuiContextHook *hook_local;
  ImGuiContext *ctx_local;
  
  if (*(long *)(hook + 8) != 0) {
    ImVector<ImGuiContextHook>::push_back(&ctx->Hooks,hook);
    return;
  }
  __assert_fail("hook->Callback != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                ,0xd35,"void ImGui::AddContextHook(ImGuiContext *, const ImGuiContextHook *)");
}

Assistant:

void ImGui::AddContextHook(ImGuiContext* ctx, const ImGuiContextHook* hook)
{
    ImGuiContext& g = *ctx;
    IM_ASSERT(hook->Callback != NULL);
    g.Hooks.push_back(*hook);
}